

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[14],char_const*,char[23],std::__cxx11::string,char[46]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [14],char **RestArgs,char (*RestArgs_1) [23],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_2,
               char (*RestArgs_3) [46])

{
  char (*RestArgs_local_3) [46];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_local_2;
  char (*RestArgs_local_1) [23];
  char **RestArgs_local;
  char (*FirstArg_local) [14];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[14]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[23],std::__cxx11::string,char[46]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}